

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtilAsmJs.cpp
# Opt level: O2

bool Js::OpCodeUtilAsmJs::IsValidByteCodeOpcode(OpCodeAsmJs op)

{
  return (ushort)(op - InvalidOpCode) < 0x172 || op < (Simd128_I_ArgOut_I4|Ret);
}

Assistant:

bool OpCodeUtilAsmJs::IsValidByteCodeOpcode(OpCodeAsmJs op)
    {
        // These OpCodes must have the same value for asm.js and normal javascript.
        // This CompileAssert will make sure to update both lists if any changes are made
        CompileAssert((uint)OpCodeAsmJs::EndOfBlock                 == (uint)OpCode::EndOfBlock);
        CompileAssert((uint)OpCodeAsmJs::ExtendedOpcodePrefix       == (uint)OpCode::ExtendedOpcodePrefix);
        CompileAssert((uint)OpCodeAsmJs::MediumLayoutPrefix         == (uint)OpCode::MediumLayoutPrefix);
        CompileAssert((uint)OpCodeAsmJs::ExtendedMediumLayoutPrefix == (uint)OpCode::ExtendedMediumLayoutPrefix);
        CompileAssert((uint)OpCodeAsmJs::LargeLayoutPrefix          == (uint)OpCode::LargeLayoutPrefix);
        CompileAssert((uint)OpCodeAsmJs::ExtendedLargeLayoutPrefix  == (uint)OpCode::ExtendedLargeLayoutPrefix);
        CompileAssert((uint)OpCodeAsmJs::Nop                        == (uint)OpCode::Nop);
        CompileAssert((uint)OpCodeAsmJs::InvalidOpCode              == (uint)OpCode::InvalidOpCode);

        CompileAssert((int)Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1 + _countof(OpCodeUtilAsmJs::ExtendedOpCodeAsmJsLayouts) == (int)Js::OpCodeAsmJs::ByteCodeLast);
        return op < _countof(OpCodeAsmJsLayouts)
            || (op > Js::OpCodeAsmJs::MaxByteSizedOpcodes && op < Js::OpCodeAsmJs::ByteCodeLast);
    }